

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O0

uint32_t farmhash32_mk_len_13_to_24(char *s,size_t len,uint32_t seed)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  ulong in_RSI;
  char *in_RDI;
  uint32_t h;
  uint32_t f;
  uint32_t e;
  uint32_t d;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  
  uVar1 = fetch32(in_RDI + ((in_RSI >> 1) - 4));
  fetch32(in_RDI + 4);
  uVar2 = fetch32(in_RDI + (in_RSI - 8));
  uVar3 = fetch32(in_RDI + (in_RSI >> 1));
  fetch32(in_RDI);
  uVar4 = fetch32(in_RDI + (in_RSI - 4));
  uVar1 = ror32(uVar1,0xc);
  mur(0,0x212963);
  uVar1 = ror32(uVar1 + uVar4,3);
  mur(0,0x21298e);
  uVar1 = ror32(uVar1 + uVar2 + uVar4,0xc);
  uVar2 = mur(0,0x2129c1);
  uVar1 = fmix(uVar2 + uVar1 + uVar3);
  return uVar1;
}

Assistant:

static inline uint32_t farmhash32_mk_len_13_to_24(const char *s, size_t len, uint32_t seed) {
  uint32_t a = fetch32(s - 4 + (len >> 1));
  uint32_t b = fetch32(s + 4);
  uint32_t c = fetch32(s + len - 8);
  uint32_t d = fetch32(s + (len >> 1));
  uint32_t e = fetch32(s);
  uint32_t f = fetch32(s + len - 4);
  uint32_t h = d * c1 + len + seed;
  a = ror32(a, 12) + f;
  h = mur(c, h) + a;
  a = ror32(a, 3) + c;
  h = mur(e, h) + a;
  a = ror32(a + f, 12) + d;
  h = mur(b ^ seed, h) + a;
  return fmix(h);
}